

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O3

void pegmatite::_syntax_Error(ErrorReporter *err,Context *con)

{
  undefined4 uVar1;
  undefined4 uVar2;
  ParserPosition r;
  long *local_78 [2];
  long local_68 [2];
  ParserPosition local_58;
  InputRange local_40;
  
  local_58.it.buffer = (con->error_pos).it.buffer;
  uVar1 = (con->error_pos).line;
  uVar2 = (con->error_pos).col;
  local_58.it.idx = (con->error_pos).it.idx + 1;
  local_58.col = uVar2 + 1;
  local_58.line = uVar1;
  InputRange::InputRange(&local_40,&con->error_pos,&local_58);
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"syntax error","");
  if (*(long *)(err + 0x10) != 0) {
    (**(code **)(err + 0x18))(err,&local_40,local_78);
    if (local_78[0] != local_68) {
      operator_delete(local_78[0],local_68[0] + 1);
    }
    return;
  }
  std::__throw_bad_function_call();
}

Assistant:

static void _syntax_Error(ErrorReporter &err, Context &con)
{
	err(InputRange(con.error_pos, _next_pos(con.error_pos)), "syntax error");
}